

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeResolveLabel(Vdbe *v,int x)

{
  int iVar1;
  Parse *p;
  int *piVar2;
  ulong uVar3;
  
  p = v->pParse;
  if (-1 < p->nLabel + p->nLabelAlloc) {
    p->aLabel[~x] = v->nOp;
    return;
  }
  iVar1 = p->nLabel;
  uVar3 = 10 - (long)iVar1;
  piVar2 = (int *)sqlite3DbReallocOrFree(p->db,p->aLabel,uVar3 * 4);
  p->aLabel = piVar2;
  if (piVar2 == (int *)0x0) {
    p->nLabelAlloc = 0;
  }
  else {
    if ((iVar1 < -0x59) && (p->nLabelAlloc / 100 < (int)((uVar3 & 0xffffffff) / 100))) {
      sqlite3ProgressCheck(p);
    }
    p->nLabelAlloc = (int)uVar3;
    p->aLabel[~x] = v->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeResolveLabel(Vdbe *v, int x){
  Parse *p = v->pParse;
  int j = ADDR(x);
  assert( v->eVdbeState==VDBE_INIT_STATE );
  assert( j<-p->nLabel );
  assert( j>=0 );
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    printf("RESOLVE LABEL %d to %d\n", x, v->nOp);
  }
#endif
  if( p->nLabelAlloc + p->nLabel < 0 ){
    resizeResolveLabel(p,v,j);
  }else{
    assert( p->aLabel[j]==(-1) ); /* Labels may only be resolved once */
    p->aLabel[j] = v->nOp;
  }
}